

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O0

void ELFIO::dump::symbol_table
               (ostream *out,Elf_Xword no,string *name,Elf64_Addr value,Elf_Xword size,uchar bind,
               uchar type,Elf_Half section,uint elf_class)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  void *pvVar4;
  string local_128;
  char local_105;
  int local_104;
  string local_100;
  char local_dd;
  int local_dc;
  char local_d5;
  int local_d4;
  char local_cd;
  int local_cc;
  char local_c5;
  int local_c4;
  char local_bd;
  int local_bc;
  char local_b5;
  int local_b4;
  string local_b0;
  char local_89;
  int local_88;
  string local_78;
  char local_55;
  int local_54;
  char local_4d;
  int local_4c;
  char local_45;
  int local_44;
  char local_3d;
  int local_3c;
  fmtflags local_38;
  uchar local_31;
  fmtflags original_flags;
  uchar bind_local;
  Elf_Xword size_local;
  Elf64_Addr value_local;
  string *name_local;
  Elf_Xword no_local;
  ostream *out_local;
  
  local_31 = bind;
  _original_flags = size;
  size_local = value;
  value_local = (Elf64_Addr)name;
  name_local = (string *)no;
  no_local = (Elf_Xword)out;
  local_38 = std::ios_base::flags((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  if (elf_class == 1) {
    poVar3 = std::operator<<((ostream *)no_local,"[");
    local_3c = (int)std::setw(5);
    poVar3 = std::operator<<(poVar3,(_Setw)local_3c);
    local_3d = (char)std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,local_3d);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,(ulong)name_local);
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3,"0x");
    local_44 = (int)std::setw(8);
    poVar3 = std::operator<<(poVar3,(_Setw)local_44);
    local_45 = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_45);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,size_local);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    local_4c = (int)std::setw(8);
    poVar3 = std::operator<<(poVar3,(_Setw)local_4c);
    local_4d = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_4d);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,_original_flags);
    poVar3 = std::operator<<(poVar3," ");
    local_54 = (int)std::setw(7);
    poVar3 = std::operator<<(poVar3,(_Setw)local_54);
    local_55 = (char)std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,local_55);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::left);
    str_symbol_type<unsigned_char>(&local_78,type);
    poVar3 = std::operator<<(poVar3,(string *)&local_78);
    poVar3 = std::operator<<(poVar3," ");
    local_88 = (int)std::setw(8);
    poVar3 = std::operator<<(poVar3,(_Setw)local_88);
    local_89 = (char)std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,local_89);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::left);
    str_symbol_bind<unsigned_char>(&local_b0,local_31);
    poVar3 = std::operator<<(poVar3,(string *)&local_b0);
    poVar3 = std::operator<<(poVar3," ");
    local_b4 = (int)std::setw(5);
    poVar3 = std::operator<<(poVar3,(_Setw)local_b4);
    local_b5 = (char)std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,local_b5);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,section);
    poVar3 = std::operator<<(poVar3," ");
    local_bc = (int)std::setw(1);
    poVar3 = std::operator<<(poVar3,(_Setw)local_bc);
    local_bd = (char)std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,local_bd);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::left);
    poVar3 = std::operator<<(poVar3,(string *)value_local);
    poVar3 = std::operator<<(poVar3," ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    poVar3 = std::operator<<((ostream *)no_local,"[");
    local_c4 = (int)std::setw(5);
    poVar3 = std::operator<<(poVar3,(_Setw)local_c4);
    local_c5 = (char)std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,local_c5);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,(ulong)name_local);
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3,"0x");
    local_cc = (int)std::setw(0x10);
    poVar3 = std::operator<<(poVar3,(_Setw)local_cc);
    local_cd = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_cd);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,size_local);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"0x");
    local_d4 = (int)std::setw(0x10);
    poVar3 = std::operator<<(poVar3,(_Setw)local_d4);
    local_d5 = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_d5);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,_original_flags);
    poVar3 = std::operator<<(poVar3," ");
    local_dc = (int)std::setw(7);
    poVar3 = std::operator<<(poVar3,(_Setw)local_dc);
    local_dd = (char)std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,local_dd);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::left);
    str_symbol_type<unsigned_char>(&local_100,type);
    poVar3 = std::operator<<(poVar3,(string *)&local_100);
    poVar3 = std::operator<<(poVar3," ");
    local_104 = (int)std::setw(8);
    poVar3 = std::operator<<(poVar3,(_Setw)local_104);
    local_105 = (char)std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,local_105);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::left);
    str_symbol_bind<unsigned_char>(&local_128,local_31);
    poVar3 = std::operator<<(poVar3,(string *)&local_128);
    poVar3 = std::operator<<(poVar3," ");
    _Var2 = std::setw(5);
    poVar3 = std::operator<<(poVar3,_Var2);
    _Var1 = std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::right);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,section);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"        ");
    _Var2 = std::setw(1);
    poVar3 = std::operator<<(poVar3,_Var2);
    _Var1 = std::setfill<char>(' ');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,std::left);
    poVar3 = std::operator<<(poVar3,(string *)value_local);
    poVar3 = std::operator<<(poVar3," ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_100);
  }
  std::ios_base::flags((ios_base *)(no_local + *(long *)(*(long *)no_local + -0x18)),local_38);
  return;
}

Assistant:

static void symbol_table( std::ostream&      out,
                              Elf_Xword          no,
                              const std::string& name,
                              Elf64_Addr         value,
                              Elf_Xword          size,
                              unsigned char      bind,
                              unsigned char      type,
                              Elf_Half           section,
                              unsigned int       elf_class )
    {
        std::ios_base::fmtflags original_flags = out.flags();

        if ( elf_class == ELFCLASS32 ) { // Output for 32-bit
            out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
                << DUMP_HEX0x_FORMAT( 8 ) << value << " "
                << DUMP_HEX0x_FORMAT( 8 ) << size << " " << DUMP_STR_FORMAT( 7 )
                << str_symbol_type( type ) << " " << DUMP_STR_FORMAT( 8 )
                << str_symbol_bind( bind ) << " " << DUMP_DEC_FORMAT( 5 )
                << section << " " << DUMP_STR_FORMAT( 1 ) << name << " "
                << std::endl;
        }
        else { // Output for 64-bit
            out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
                << DUMP_HEX0x_FORMAT( 16 ) << value << " "
                << DUMP_HEX0x_FORMAT( 16 ) << size << " "
                << DUMP_STR_FORMAT( 7 ) << str_symbol_type( type ) << " "
                << DUMP_STR_FORMAT( 8 ) << str_symbol_bind( bind ) << " "
                << DUMP_DEC_FORMAT( 5 ) << section << " " << std::endl
                << "        " << DUMP_STR_FORMAT( 1 ) << name << " "
                << std::endl;
        }

        out.flags( original_flags );
    }